

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

decimal_fp<float> fmt::v10::detail::dragonbox::to_decimal<float>(float x)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char cVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  
  uVar12 = (uint)x & 0x7fffff;
  uVar5 = (uint)x >> 0x17 & 0xff;
  if (uVar5 == 0) {
    uVar5 = 0xffffff6b;
    if (uVar12 == 0) {
      uVar6 = 0;
      uVar10 = 0;
      goto LAB_001590bb;
    }
  }
  else {
    uVar5 = uVar5 - 0x96;
    if (uVar12 == 0) {
      uVar12 = (int)(uVar5 * 0x9a209 + -0x3fe1f) >> 0x15;
      uVar10 = (ulong)uVar12;
      cVar8 = (char)((int)(uVar12 * -0x1a934f) >> 0x13) + (char)uVar5;
      uVar11 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                         (ulong)(0x1f - uVar12) * 8);
      bVar4 = 0x28 - cVar8;
      uVar9 = (uint)((uVar5 & 0xfffffffe) != 2) + (int)(uVar11 - (uVar11 >> 0x19) >> (bVar4 & 0x3f))
      ;
      uVar2 = (uVar11 >> 0x18) + uVar11 >> (bVar4 & 0x3f) & 0xffffffff;
      if ((uint)((int)(uVar2 / 10) * 10) < uVar9) {
        uVar6 = (int)(uVar11 >> (0x27U - cVar8 & 0x3f)) + 1U >> 1;
        if (uVar5 == 0xffffffdd) {
          uVar6 = uVar6 & 0xfffffffe;
        }
        else {
          uVar6 = uVar6 + (uVar6 < uVar9);
        }
      }
      else {
        uVar10 = uVar2 / 10;
        uVar5 = 0;
        do {
          uVar9 = uVar5;
          uVar6 = (int)uVar10 * 0x40000000 | (uint)((int)uVar10 * -0x3d70a3d7) >> 2;
          uVar11 = (ulong)uVar6;
          if (0x28f5c28 < uVar6) {
            uVar11 = uVar10;
          }
          uVar10 = uVar11;
          uVar5 = uVar9 + 2;
        } while (0x28f5c28 >= uVar6);
        uVar5 = (uint)uVar11 * -0x33333333;
        uVar5 = uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f;
        uVar6 = uVar5;
        if (uVar5 >= 0x1999999a) {
          uVar6 = (uint)uVar11;
        }
        uVar10 = (ulong)(uVar12 + (uVar9 | uVar5 < 0x1999999a) + 1);
      }
      goto LAB_001590bb;
    }
    uVar12 = uVar12 | 0x800000;
  }
  uVar9 = (int)(uVar5 * 0x4d105) >> 0x14;
  uVar10 = (ulong)uVar9;
  uVar11 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                     (ulong)(0x20 - uVar9) * 8);
  bVar4 = (char)((int)((1 - uVar9) * 0x1a934f) >> 0x13) + (char)uVar5;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar11;
  auVar1 = (ZEXT416(uVar12 * 2 + 1 << (bVar4 & 0x1f)) << 0x20) * auVar1;
  uVar2 = auVar1._8_8_ >> 0x20;
  iVar13 = (int)(uVar2 / 100);
  iVar7 = (int)(uVar2 / 100);
  uVar6 = iVar7 * -100 + auVar1._12_4_;
  uVar5 = (uint)(uVar11 >> (~bVar4 & 0x3f));
  if (uVar6 < uVar5) {
    if ((uVar6 != 0) || ((auVar1._8_4_ != 0 || ((uVar12 & 1) == 0)))) {
LAB_00158f2e:
      uVar10 = uVar2 / 100;
      uVar5 = 0;
      do {
        uVar12 = uVar5;
        uVar6 = (int)uVar10 * 0x40000000 | (uint)((int)uVar10 * -0x3d70a3d7) >> 2;
        uVar11 = (ulong)uVar6;
        if (0x28f5c28 < uVar6) {
          uVar11 = uVar10;
        }
        uVar10 = uVar11;
        uVar5 = uVar12 + 2;
      } while (0x28f5c28 >= uVar6);
      uVar5 = (uint)uVar11 * -0x33333333;
      uVar5 = uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f;
      uVar6 = uVar5;
      if (uVar5 >= 0x1999999a) {
        uVar6 = (uint)uVar11;
      }
      uVar10 = (ulong)(uVar9 + (uVar12 | uVar5 < 0x1999999a) + 1);
      goto LAB_001590bb;
    }
    iVar13 = iVar7 + -1;
    uVar6 = 100;
  }
  else if ((uVar6 <= uVar5) &&
          (uVar3 = (uVar12 * 2 - 1) * uVar11,
          ((uint)((int)(uVar3 >> (-(bVar4 + 0x20) & 0x3f)) == 0) & ~uVar12) != 0 ||
          (uVar3 >> ((ulong)(byte)(0x40 - bVar4) & 0x3f) & 1) != 0)) goto LAB_00158f2e;
  iVar7 = uVar6 - (uVar5 >> 1);
  uVar5 = iVar7 * 0x199a + 0x8002;
  uVar6 = (uVar5 >> 0x10) + iVar13 * 10;
  if ((uVar5 & 0xffff) < 0x199a) {
    uVar11 = uVar11 * (uVar12 * 2);
    if (((uVar11 >> ((ulong)(byte)(0x40 - bVar4) & 0x3f) & 1) != 0) == (bool)((byte)iVar7 & 1)) {
      uVar6 = uVar6 - ((byte)(uVar5 >> 0x10) & 1 & (int)(uVar11 >> (-(bVar4 + 0x20) & 0x3f)) == 0);
    }
    else {
      uVar6 = uVar6 - 1;
    }
  }
LAB_001590bb:
  return (decimal_fp<float>)((ulong)uVar6 | uVar10 << 0x20);
}

Assistant:

FMT_CONSTEXPR20 auto bit_cast(const From& from) -> To {
#ifdef __cpp_lib_bit_cast
  if (is_constant_evaluated()) return std::bit_cast<To>(from);
#endif
  auto to = To();
  // The cast suppresses a bogus -Wclass-memaccess on GCC.
  std::memcpy(static_cast<void*>(&to), &from, sizeof(to));
  return to;
}